

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O1

DWORD FILEGetDirectoryFromFullPathA(LPCSTR lpFullPath,DWORD nBufferLength,LPSTR lpBuffer)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  
  uVar1 = lstrlenA(lpFullPath);
  pcVar4 = lpFullPath + (int)uVar1;
  do {
    uVar2 = uVar1;
    pcVar4 = pcVar4 + -1;
    if ((pcVar4 < lpFullPath) || (*pcVar4 == '\\')) break;
    uVar1 = uVar2 - 1;
  } while (*pcVar4 != '/');
  uVar1 = 0;
  if (uVar2 - 1 < 0x7fffffff) {
    if (uVar2 < nBufferLength) {
      uVar3 = 0;
      do {
        lpBuffer[uVar3] = lpFullPath[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar2 != uVar3);
      lpBuffer[uVar3 & 0xffffffff] = '\0';
      uVar1 = uVar2;
    }
    else {
      uVar1 = uVar2 + 1;
    }
  }
  return uVar1;
}

Assistant:

DWORD FILEGetDirectoryFromFullPathA( LPCSTR lpFullPath,
                     DWORD  nBufferLength,
                     LPSTR  lpBuffer )
{
    int    full_len, dir_len, i;
    LPCSTR lpDirEnd;
    DWORD  dwRetLength;

    full_len = lstrlenA( lpFullPath );

    /* look for the first path separator backwards */
    lpDirEnd = lpFullPath + full_len - 1;
    while( lpDirEnd >= lpFullPath && *lpDirEnd != '/' && *lpDirEnd != '\\')
    --lpDirEnd;

    dir_len = lpDirEnd - lpFullPath + 1; /* +1 for fencepost */

    if ( dir_len <= 0 )
    {
        dwRetLength = 0;
    }
    else if (static_cast<DWORD>(dir_len) >= nBufferLength)
    {
        dwRetLength = dir_len + 1; /* +1 for NULL char */
    }
    else
    {
    /* put the directory into the buffer, including 1 or more
       trailing path separators */
    for( i = 0; i < dir_len; ++i )
        *(lpBuffer + i) = *(lpFullPath + i);

    *(lpBuffer + i) = '\0';

    dwRetLength = dir_len;
    }

    return( dwRetLength );
}